

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86OR(uchar *stream,x86Reg op1,x86Reg op2)

{
  byte bVar1;
  uchar *start;
  bool bVar2;
  
  bVar1 = 8 < (int)op1 | (8 < (int)op2) << 2;
  bVar2 = bVar1 != 0;
  if (bVar2) {
    *stream = bVar1 | 0x40;
  }
  stream[bVar2] = '\t';
  if (7 < (byte)regCode[op2]) {
    __assert_fail("unsigned(spareField) <= 0x7",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x15,"unsigned char encodeRegister(x86Reg, char)");
  }
  (stream + bVar2)[1] = regCode[op2] << 3 | regCode[op1] | 0xc0;
  return ((int)(stream + bVar2) - (int)stream) + 2;
}

Assistant:

unsigned encodeRex(unsigned char* stream, bool operand64Bit, x86Reg dst, x86Reg src)
{
	unsigned char code = (operand64Bit ? 0x08 : 0x00) | (src >= rR8 ? 0x04 : 0x00) | (dst >= rR8 ? 0x01 : 0x00); // Reverse for some reason

	if(code)
	{
		assert(sizeof(void*) == 8);

		*stream = 0x40 | code;
		return 1;
	}

	return 0;
}